

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# np_nes_apu.c
# Opt level: O0

void NES_APU_np_FrameSequence(void *chip,int s)

{
  bool bVar1;
  undefined4 local_2c;
  int local_24;
  _Bool divider;
  int i;
  NES_APU *apu;
  int s_local;
  void *chip_local;
  
  if (s < 4) {
    for (local_24 = 0; local_24 < 2; local_24 = local_24 + 1) {
      bVar1 = false;
      if ((*(byte *)((long)chip + (long)local_24 + 0x13c) & 1) == 0) {
        *(int *)((long)chip + (long)local_24 * 4 + 0x148) =
             *(int *)((long)chip + (long)local_24 * 4 + 0x148) + 1;
        bVar1 = *(int *)((long)chip + (long)local_24 * 4 + 0x140) <
                *(int *)((long)chip + (long)local_24 * 4 + 0x148);
        if (bVar1) {
          *(undefined4 *)((long)chip + (long)local_24 * 4 + 0x148) = 0;
        }
      }
      else {
        *(undefined1 *)((long)chip + (long)local_24 + 0x13c) = 0;
        *(undefined4 *)((long)chip + (long)local_24 * 4 + 0x150) = 0xf;
        *(undefined4 *)((long)chip + (long)local_24 * 4 + 0x148) = 0;
      }
      if (bVar1) {
        if (((*(byte *)((long)chip + (long)local_24 + 0x13a) & 1) == 0) ||
           (*(int *)((long)chip + (long)local_24 * 4 + 0x150) != 0)) {
          if (0 < *(int *)((long)chip + (long)local_24 * 4 + 0x150)) {
            *(int *)((long)chip + (long)local_24 * 4 + 0x150) =
                 *(int *)((long)chip + (long)local_24 * 4 + 0x150) + -1;
          }
        }
        else {
          *(undefined4 *)((long)chip + (long)local_24 * 4 + 0x150) = 0xf;
        }
      }
    }
    if ((s & 1U) == 0) {
      for (local_24 = 0; local_24 < 2; local_24 = local_24 + 1) {
        if (((*(byte *)((long)chip + (long)local_24 + 0x13a) & 1) == 0) &&
           (0 < *(int *)((long)chip + (long)local_24 * 4 + 0x158))) {
          *(int *)((long)chip + (long)local_24 * 4 + 0x158) =
               *(int *)((long)chip + (long)local_24 * 4 + 0x158) + -1;
        }
        if ((*(byte *)((long)chip + (long)local_24 + 0x118) & 1) != 0) {
          *(int *)((long)chip + (long)local_24 * 4 + 0x128) =
               *(int *)((long)chip + (long)local_24 * 4 + 0x128) + -1;
          if (*(int *)((long)chip + (long)local_24 * 4 + 0x128) < 1) {
            sweep_sqr((NES_APU *)chip,local_24);
            if (((7 < *(int *)((long)chip + (long)local_24 * 4 + 0x108)) &&
                (*(int *)((long)chip + (long)local_24 * 4 + 0x110) < 0x800)) &&
               (0 < *(int *)((long)chip + (long)local_24 * 4 + 0x130))) {
              if (*(int *)((long)chip + (long)local_24 * 4 + 0x110) < 0) {
                local_2c = 0;
              }
              else {
                local_2c = *(undefined4 *)((long)chip + (long)local_24 * 4 + 0x110);
              }
              *(undefined4 *)((long)chip + (long)local_24 * 4 + 0x108) = local_2c;
            }
            *(int *)((long)chip + (long)local_24 * 4 + 0x128) =
                 *(int *)((long)chip + (long)local_24 * 4 + 0x120) + 1;
          }
          if ((*(byte *)((long)chip + (long)local_24 + 0x11c) & 1) != 0) {
            *(int *)((long)chip + (long)local_24 * 4 + 0x128) =
                 *(int *)((long)chip + (long)local_24 * 4 + 0x120) + 1;
            *(undefined1 *)((long)chip + (long)local_24 + 0x11c) = 0;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void NES_APU_np_FrameSequence(void* chip, int s)
{
	NES_APU* apu = (NES_APU*)chip;
	int i;

	//DEBUG_OUT("FrameSequence(%d)\n",s);

	if (s > 3) return; // no operation in step 4

	// 240hz clock
	for (i=0; i < 2; ++i)
	{
		bool divider = false;
		if (apu->envelope_write[i])
		{
			apu->envelope_write[i] = false;
			apu->envelope_counter[i] = 15;
			apu->envelope_div[i] = 0;
		}
		else
		{
			++apu->envelope_div[i];
			if (apu->envelope_div[i] > apu->envelope_div_period[i])
			{
				divider = true;
				apu->envelope_div[i] = 0;
			}
		}
		if (divider)
		{
			if (apu->envelope_loop[i] && apu->envelope_counter[i] == 0)
				apu->envelope_counter[i] = 15;
			else if (apu->envelope_counter[i] > 0)
				--apu->envelope_counter[i];
		}
	}

	// 120hz clock
	if ((s&1) == 0)
	  for (i=0; i < 2; ++i)
	  {
		if (!apu->envelope_loop[i] && (apu->length_counter[i] > 0))
			--apu->length_counter[i];

		if (apu->sweep_enable[i])
		{
			//DEBUG_OUT("Clock sweep: %d\n", i);

			--apu->sweep_div[i];
			if (apu->sweep_div[i] <= 0)
			{
				sweep_sqr(apu, i);	// calculate new sweep target

				//DEBUG_OUT("sweep_div[%d] (0/%d)\n",i,apu->sweep_div_period[i]);
				//DEBUG_OUT("freq[%d]=%d > sfreq[%d]=%d\n",i,apu->freq[i],i,apu->sfreq[i]);

				if (apu->freq[i] >= 8 && apu->sfreq[i] < 0x800 && apu->sweep_amount[i] > 0) // update frequency if appropriate
				{
					apu->freq[i] = apu->sfreq[i] < 0 ? 0 : apu->sfreq[i];
				}
				apu->sweep_div[i] = apu->sweep_div_period[i] + 1;

				//DEBUG_OUT("freq[%d]=%d\n",i,apu->freq[i]);
			}

			if (apu->sweep_write[i])
			{
				apu->sweep_div[i] = apu->sweep_div_period[i] + 1;
				apu->sweep_write[i] = false;
			}
		}
	  }

}